

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericProperty.h
# Opt level: O2

bool HasGenericProperty<float>
               (map<unsigned_int,_float,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
                *list,char *szName)

{
  const_iterator cVar1;
  uint32_t hash;
  
  if (szName != (char *)0x0) {
    hash = SuperFastHash(szName,0,0);
    cVar1 = std::
            _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_float>,_std::_Select1st<std::pair<const_unsigned_int,_float>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_float>_>_>
            ::find(&list->_M_t,&hash);
    return (_Rb_tree_header *)cVar1._M_node != &(list->_M_t)._M_impl.super__Rb_tree_header;
  }
  __assert_fail("nullptr != szName",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/include/assimp/GenericProperty.h"
                ,0x7f,
                "bool HasGenericProperty(const std::map<unsigned int, T> &, const char *) [T = float]"
               );
}

Assistant:

inline
bool HasGenericProperty(const std::map< unsigned int, T >& list,
        const char* szName) {
    ai_assert(nullptr != szName);
    const uint32_t hash = SuperFastHash(szName);

    typename std::map<unsigned int, T>::const_iterator it = list.find(hash);
    if (it == list.end()) {
        return false;
    }

    return true;
}